

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OgreXmlSerializer.cpp
# Opt level: O2

bool __thiscall
Assimp::Ogre::OgreXmlSerializer::ReadAttribute<bool>(OgreXmlSerializer *this,char *name)

{
  XmlReader *reader;
  int iVar1;
  int iVar2;
  string value;
  allocator<char> local_c1;
  string local_c0;
  string local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  string local_40;
  
  ReadAttribute<std::__cxx11::string>(&local_40,this,name);
  ToLower(&local_a0,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c0,"true",(allocator<char> *)&local_80);
  iVar1 = ASSIMP_stricmp(&local_a0,&local_c0);
  std::__cxx11::string::~string((string *)&local_c0);
  if (iVar1 != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c0,"false",(allocator<char> *)&local_80);
    iVar2 = ASSIMP_stricmp(&local_a0,&local_c0);
    std::__cxx11::string::~string((string *)&local_c0);
    if (iVar2 != 0) {
      reader = this->m_reader;
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_c0,name,&local_c1);
      std::operator+(&local_60,
                     "Boolean value is expected to be \'true\' or \'false\', encountered \'",
                     &local_a0);
      std::operator+(&local_80,&local_60,"\'");
      ThrowAttibuteError(reader,&local_c0,&local_80);
    }
  }
  std::__cxx11::string::~string((string *)&local_a0);
  return iVar1 == 0;
}

Assistant:

bool OgreXmlSerializer::ReadAttribute<bool>(const char *name) const
{
    std::string value = Ogre::ToLower(ReadAttribute<std::string>(name));
    if (ASSIMP_stricmp(value, "true") == 0)
    {
        return true;
    }
    else if (ASSIMP_stricmp(value, "false") == 0)
    {
        return false;
    }
    else
    {
        ThrowAttibuteError(m_reader, name, "Boolean value is expected to be 'true' or 'false', encountered '" + value + "'");
        return false;
    }
}